

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapid_json_serial_impl.cpp
# Opt level: O3

void rapid_json_serial_impl_serialize_value(value v,Value *json_v)

{
  char cVar1;
  short sVar2;
  undefined4 uVar3;
  int iVar4;
  ulong uVar5;
  undefined1 *puVar6;
  char *pcVar7;
  size_t sVar8;
  undefined8 uVar9;
  value v_00;
  long lVar10;
  long lVar11;
  undefined8 *puVar12;
  Number NVar13;
  undefined1 *puVar14;
  uint16_t uVar15;
  SizeType SVar16;
  Number NVar17;
  long lVar18;
  ushort uVar19;
  char *data;
  bool bVar20;
  float fVar21;
  Value label_member;
  string s;
  Value stacktrace_member;
  Value code_member;
  Value stacktrace_value;
  Value label_value;
  ostringstream ostream;
  Data local_228;
  Data local_218;
  undefined1 local_208 [16];
  Data local_1f8;
  Data local_1e8;
  Data local_1d8;
  Data local_1c8;
  Data local_1b8;
  Data local_1a8 [7];
  ios_base local_138 [264];
  
  uVar3 = value_type_id();
  switch(uVar3) {
  case 0:
    cVar1 = value_to_bool(v);
    (json_v->data_).n = (Number)0x0;
    (json_v->data_).s.str = (Ch *)0x0;
    (json_v->data_).f.flags = (cVar1 == '\x01') + 9;
    break;
  case 1:
    value_to_char(v);
    (json_v->data_).s.str = (Ch *)((ulong)local_1a8 | 0x405000000000000);
    (json_v->data_).s.length = 1;
    break;
  case 2:
    sVar2 = value_to_short(v);
    (json_v->data_).s.str = (Ch *)0x0;
    *(long *)&json_v->data_ = (long)sVar2;
    bVar20 = sVar2 < 0;
    goto LAB_00103d5a;
  case 3:
    iVar4 = value_to_int(v);
    (json_v->data_).s.str = (Ch *)0x0;
    *(long *)&json_v->data_ = (long)iVar4;
    bVar20 = iVar4 < 0;
LAB_00103d5a:
    uVar15 = 0xb6;
    if (!bVar20) {
      uVar15 = 0x1f6;
    }
    (json_v->data_).f.flags = uVar15;
    break;
  case 4:
    uVar5 = value_to_long(v);
    log_write_impl_va("metacall",0x6c,"rapid_json_serial_impl_serialize_value",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/serials/rapid_json_serial/source/rapid_json_serial_impl.cpp"
                      ,2,
                      "Casting long to int64_t (posible incompatible types) in RapidJSON implementation"
                     );
    (json_v->data_).s.str = (Ch *)0x96000000000000;
    *(ulong *)&json_v->data_ = uVar5;
    if ((long)uVar5 < 0) {
      uVar19 = 0xb6;
      if (uVar5 < 0xffffffff80000000) {
        return;
      }
    }
    else {
      uVar19 = 0x1f6;
      if ((uVar5 & 0xffffffff80000000) != 0) {
        uVar19 = (ushort)(uVar5 >> 0x20 == 0) << 6 | 0x196;
      }
    }
    (json_v->data_).f.flags = uVar19;
    break;
  case 5:
    fVar21 = (float)value_to_float(v);
    NVar13.d = (double)fVar21;
    goto LAB_00103fe8;
  case 6:
    NVar13.i64 = value_to_double(v);
LAB_00103fe8:
    (json_v->data_).s.str = (Ch *)0x216000000000000;
    (json_v->data_).n = NVar13;
    break;
  case 7:
    puVar6 = (undefined1 *)value_to_string(v);
    lVar10 = value_type_size(v);
    SVar16 = 0;
    if (lVar10 != 0) {
      SVar16 = (int)lVar10 - 1;
    }
    puVar14 = &rapidjson::GenericStringRef<char>::emptyString;
    if (puVar6 != (undefined1 *)0x0) {
      puVar14 = puVar6;
    }
    (json_v->data_).s.str = (Ch *)((ulong)puVar14 | 0x405000000000000);
    (json_v->data_).s.length = SVar16;
    break;
  case 8:
    (json_v->data_).n = (Number)0x0;
    (json_v->data_).s.str = (Ch *)0x0;
    (json_v->data_).f.flags = 3;
    local_1a8[0].n = (Number)0x0;
    local_1a8[0].s.str = (Ch *)0x4000000000000;
    pcVar7 = (char *)value_to_buffer(v);
    NVar13.i64 = value_type_size(v);
    if (NVar13.i64 != 0) {
      NVar17.i64 = NVar13.i64;
      do {
        local_218.s.length = (SizeType)*pcVar7;
        local_218._4_1_ = '\0';
        local_218._5_1_ = '\0';
        local_218._6_1_ = '\0';
        local_218._7_1_ = '\0';
        local_218.s.str = (Ch *)((ulong)(-1 < *pcVar7) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_1a8[0].s,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_218.s,&rapid_json_allocator);
        pcVar7 = pcVar7 + 1;
        NVar17.i64 = NVar17.i64 - 1;
      } while (NVar17.i64 != 0);
    }
    local_218.s.str = (Ch *)0x40500000010847c;
    local_218.n = (Number)0x4;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    DoAddMember(json_v,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_218.s,
                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_1a8[0].s,&rapid_json_allocator);
    local_218.s.str = (Ch *)0x405000000108481;
    local_218.n = (Number)0x6;
    uVar19 = (ushort)((NVar13.u64 & 0xffffffff80000000) == 0) << 5 | 0x1d6;
    if (NVar13.u64 >> 0x20 != 0) {
      uVar19 = (ushort)(-1 < NVar13.i64) << 7 | 0x116;
    }
    local_228.s.str = (Ch *)((ulong)uVar19 << 0x30);
    local_228.n = (Number)NVar13.i64;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    DoAddMember(json_v,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_218.s,
                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_228.s,&rapid_json_allocator);
    break;
  case 9:
    (json_v->data_).n = (Number)0x0;
    (json_v->data_).s.str = (Ch *)0x0;
    (json_v->data_).f.flags = 4;
    lVar10 = value_to_array(v);
    lVar11 = value_type_count(v);
    if (lVar11 != 0) {
      lVar18 = 0;
      do {
        local_1a8[0].n = (Number)0x0;
        local_1a8[0].s.str = (Ch *)0x0;
        rapid_json_serial_impl_serialize_value
                  (*(value *)(lVar10 + lVar18 * 8),(Value *)&local_1a8[0].s);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(json_v,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&local_1a8[0].s,&rapid_json_allocator);
        lVar18 = lVar18 + 1;
      } while (lVar11 != lVar18);
    }
    break;
  case 10:
    (json_v->data_).n = (Number)0x0;
    (json_v->data_).s.str = (Ch *)0x0;
    (json_v->data_).f.flags = 3;
    lVar10 = value_to_map(v);
    lVar11 = value_type_count(v);
    if (lVar11 != 0) {
      lVar18 = 0;
      do {
        puVar12 = (undefined8 *)value_to_array(*(undefined8 *)(lVar10 + lVar18 * 8));
        local_1a8[0].n.i64 = (Number)0x0;
        local_1a8[0].s.str = (Ch *)0x0;
        local_218.n.i64 = (Number)0x0;
        local_218.s.str = (Ch *)0x0;
        rapid_json_serial_impl_serialize_value((value)*puVar12,(Value *)&local_1a8[0].s);
        rapid_json_serial_impl_serialize_value((value)puVar12[1],(Value *)&local_218.s);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::DoAddMember(json_v,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&local_1a8[0].s,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_218.s,&rapid_json_allocator);
        lVar18 = lVar18 + 1;
      } while (lVar11 != lVar18);
    }
    break;
  case 0xb:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8[0].s);
    value_to_ptr(v);
    std::ostream::_M_insert<void_const*>(local_1a8);
    std::__cxx11::stringbuf::str();
    uVar9 = &rapidjson::GenericStringRef<char>::emptyString;
    if (local_218.n.i64 != 0) {
      uVar9 = local_218.n;
    }
    (json_v->data_).s.str = (Ch *)(uVar9 | 0x405000000000000);
    (json_v->data_).s.length = local_218._8_4_;
    if (local_218.n.i64 != (Number)local_208) {
      operator_delete((void *)local_218.n);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8[0].s);
    std::ios_base::~ios_base(local_138);
    break;
  case 0xc:
    pcVar7 = "[Future]";
    goto LAB_00103c60;
  case 0xd:
    (json_v->data_).s.str = (Ch *)0x405000000108182;
    (json_v->data_).s.length = 10;
    break;
  case 0xe:
    (json_v->data_).n = (Number)0x0;
    (json_v->data_).s.str = (Ch *)0x0;
    break;
  case 0xf:
    (json_v->data_).s.str = (Ch *)0x40500000010818d;
    (json_v->data_).s.length = 7;
    break;
  case 0x10:
    pcVar7 = "[Object]";
LAB_00103c60:
    (json_v->data_).s.str = (Ch *)((ulong)pcVar7 | 0x405000000000000);
    (json_v->data_).s.length = 8;
    break;
  case 0x11:
    (json_v->data_).n = (Number)0x0;
    (json_v->data_).s.str = (Ch *)0x0;
    (json_v->data_).f.flags = 3;
    uVar9 = value_to_exception(v);
    local_218.n = (Number)0x0;
    local_218.s.str = (Ch *)0x0;
    local_1a8[0].s.str = (Ch *)0x40500000010819e;
    local_1a8[0].n = (Number)0x7;
    puVar6 = (undefined1 *)exception_message(uVar9);
    pcVar7 = (char *)exception_message(uVar9);
    sVar8 = strlen(pcVar7);
    if (puVar6 == (undefined1 *)0x0) {
      puVar6 = &rapidjson::GenericStringRef<char>::emptyString;
    }
    local_218.s.str = (Ch *)((ulong)puVar6 | 0x405000000000000);
    local_218.s.length = (int)sVar8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    DoAddMember(json_v,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_1a8[0].s,
                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_218.s,&rapid_json_allocator);
    local_1b8.n = (Number)0x0;
    local_1b8.s.str = (Ch *)0x0;
    local_228.s.str = (Ch *)0x4050000001081a6;
    local_228.n = (Number)0x5;
    puVar6 = (undefined1 *)exception_label(uVar9);
    pcVar7 = (char *)exception_label(uVar9);
    sVar8 = strlen(pcVar7);
    if (puVar6 == (undefined1 *)0x0) {
      puVar6 = &rapidjson::GenericStringRef<char>::emptyString;
    }
    local_1b8.s.str = (Ch *)((ulong)puVar6 | 0x405000000000000);
    local_1b8.s.length = (int)sVar8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    DoAddMember(json_v,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_228.s,
                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_1b8.s,&rapid_json_allocator);
    local_1e8.s.str = (Ch *)0x4050000001081ac;
    local_1e8.n = (Number)0x4;
    local_1d8.n = (Number)exception_error_code(uVar9);
    local_1d8.s.str = (Ch *)0x96000000000000;
    if ((long)local_1d8.n < 0) {
      uVar19 = 0xb6;
      if (0xffffffff7fffffff < (ulong)local_1d8.n) goto LAB_001042b5;
    }
    else {
      uVar19 = 0x1f6;
      if (((ulong)local_1d8.n & 0xffffffff80000000) != 0) {
        uVar19 = (ushort)((ulong)local_1d8.n >> 0x20 == 0) << 6 | 0x196;
      }
LAB_001042b5:
      local_1d8.s.str = (Ch *)((ulong)uVar19 << 0x30);
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    DoAddMember(json_v,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_1e8.s,
                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_1d8.s,&rapid_json_allocator);
    local_1c8.n = (Number)0x0;
    local_1c8.s.str = (Ch *)0x0;
    local_1f8.s.str = (Ch *)0x4050000001081b1;
    local_1f8.n = (Number)0xa;
    puVar14 = (undefined1 *)exception_stacktrace(uVar9);
    pcVar7 = (char *)exception_stacktrace(uVar9);
    sVar8 = strlen(pcVar7);
    puVar6 = &rapidjson::GenericStringRef<char>::emptyString;
    if (puVar14 != (undefined1 *)0x0) {
      puVar6 = puVar14;
    }
    local_1c8.s.str = (Ch *)((ulong)puVar6 | 0x405000000000000);
    local_1c8.s.length = (int)sVar8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    DoAddMember(json_v,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_1f8.s,
                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_1c8.s,&rapid_json_allocator);
    break;
  case 0x12:
    (json_v->data_).n = (Number)0x0;
    (json_v->data_).s.str = (Ch *)0x0;
    (json_v->data_).f.flags = 3;
    uVar9 = value_to_throwable(v);
    local_218.n = (Number)0x0;
    local_218.s.str = (Ch *)0x0;
    local_1a8[0].s.str = (Ch *)0x4050000001081c0;
    local_1a8[0].n = (Number)0xf;
    v_00 = (value)throwable_value(uVar9);
    rapid_json_serial_impl_serialize_value(v_00,(Value *)&local_218.s);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    DoAddMember(json_v,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_1a8[0].s,
                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_218.s,&rapid_json_allocator);
  }
  return;
}

Assistant:

void rapid_json_serial_impl_serialize_value(value v, rapidjson::Value *json_v)
{
	type_id id = value_type_id(v);

	if (id == TYPE_BOOL)
	{
		boolean b = value_to_bool(v);

		json_v->SetBool(b == 1L ? true : false);
	}
	else if (id == TYPE_CHAR)
	{
		char str[1];

		rapidjson::SizeType length = 1;

		str[0] = value_to_char(v);

		json_v->SetString(str, length);
	}
	else if (id == TYPE_SHORT)
	{
		short s = value_to_short(v);

		int i = (int)s;

		json_v->SetInt(i);
	}
	else if (id == TYPE_INT)
	{
		int i = value_to_int(v);

		json_v->SetInt(i);
	}
	else if (id == TYPE_LONG)
	{
		long l = value_to_long(v);

		log_write("metacall", LOG_LEVEL_WARNING, "Casting long to int64_t (posible incompatible types) in RapidJSON implementation");

		json_v->SetInt64(l);
	}
	else if (id == TYPE_FLOAT)
	{
		float f = value_to_float(v);

		json_v->SetFloat(f);
	}
	else if (id == TYPE_DOUBLE)
	{
		double d = value_to_double(v);

		json_v->SetDouble(d);
	}
	else if (id == TYPE_STRING)
	{
		const char *str = value_to_string(v);

		size_t size = value_type_size(v);

		rapidjson::SizeType length = size > 0 ? (rapidjson::SizeType)(size - 1) : 0;

		json_v->SetString(str, length);
	}
	else if (id == TYPE_BUFFER)
	{
		rapidjson::Value &json_map = json_v->SetObject();

		rapidjson::Value json_array(rapidjson::kArrayType);

		void *buffer = value_to_buffer(v);

		size_t size = value_type_size(v);

		for (size_t iterator = 0; iterator < size; ++iterator)
		{
			const char *data = (const char *)(((uintptr_t)buffer) + iterator);

			rapidjson::Value json_inner_value;

			json_inner_value.SetUint((unsigned int)*data);

			json_array.PushBack(json_inner_value, rapid_json_allocator);
		}

		// Set data
		{
			rapidjson::Value json_member;

			json_member.SetString("data");

			json_map.AddMember(json_member, json_array, rapid_json_allocator);
		}

		// Set length
		{
			rapidjson::Value json_member, json_inner_value;

			json_member.SetString("length");

			json_inner_value.SetUint64((uint64_t)size);

			json_map.AddMember(json_member, json_inner_value, rapid_json_allocator);
		}
	}
	else if (id == TYPE_ARRAY)
	{
		rapidjson::Value &json_array = json_v->SetArray();

		value *value_array = value_to_array(v);

		size_t array_size = value_type_count(v);

		for (size_t iterator = 0; iterator < array_size; ++iterator)
		{
			value current_value = value_array[iterator];

			rapidjson::Value json_inner_value;

			rapid_json_serial_impl_serialize_value(current_value, &json_inner_value);

			json_array.PushBack(json_inner_value, rapid_json_allocator);
		}
	}
	else if (id == TYPE_MAP)
	{
		rapidjson::Value &json_map = json_v->SetObject();

		value *value_map = value_to_map(v);

		size_t map_size = value_type_count(v);

		for (size_t iterator = 0; iterator < map_size; ++iterator)
		{
			value tupla = value_map[iterator];

			value *tupla_array = value_to_array(tupla);

			rapidjson::Value json_member, json_inner_value;

			rapid_json_serial_impl_serialize_value(tupla_array[0], &json_member);

			rapid_json_serial_impl_serialize_value(tupla_array[1], &json_inner_value);

			json_map.AddMember(json_member, json_inner_value, rapid_json_allocator);
		}
	}
	else if (id == TYPE_FUTURE)
	{
		/* TODO: Improve future serialization */
		static const char str[] = "[Future]";

		size_t size = sizeof(str);

		rapidjson::SizeType length = size > 0 ? (rapidjson::SizeType)(size - 1) : 0;

		json_v->SetString(str, length);
	}
	else if (id == TYPE_FUNCTION)
	{
		/* TODO: Improve function serialization */
		static const char str[] = "[Function]";

		size_t size = sizeof(str);

		rapidjson::SizeType length = size > 0 ? (rapidjson::SizeType)(size - 1) : 0;

		json_v->SetString(str, length);
	}
	else if (id == TYPE_CLASS)
	{
		/* TODO: Improve class serialization */
		static const char str[] = "[Class]";

		size_t size = sizeof(str);

		rapidjson::SizeType length = size > 0 ? (rapidjson::SizeType)(size - 1) : 0;

		json_v->SetString(str, length);
	}
	else if (id == TYPE_OBJECT)
	{
		/* TODO: Improve object serialization */
		static const char str[] = "[Object]";

		size_t size = sizeof(str);

		rapidjson::SizeType length = size > 0 ? (rapidjson::SizeType)(size - 1) : 0;

		json_v->SetString(str, length);
	}
	else if (id == TYPE_EXCEPTION)
	{
		rapidjson::Value &json_map = json_v->SetObject();

		exception ex = value_to_exception(v);

		rapidjson::Value message_member, message_value;
		static const char message_str[] = "message";

		message_member.SetString(message_str, (rapidjson::SizeType)(sizeof(message_str) - 1));
		message_value.SetString(exception_message(ex), strlen(exception_message(ex)));
		json_map.AddMember(message_member, message_value, rapid_json_allocator);

		rapidjson::Value label_member, label_value;
		static const char label_str[] = "label";

		label_member.SetString(label_str, (rapidjson::SizeType)(sizeof(label_str) - 1));
		label_value.SetString(exception_label(ex), strlen(exception_label(ex)));
		json_map.AddMember(label_member, label_value, rapid_json_allocator);

		rapidjson::Value code_member, code_value;
		static const char code_str[] = "code";

		code_member.SetString(code_str, (rapidjson::SizeType)(sizeof(code_str) - 1));
		code_value.SetInt64(exception_error_code(ex));
		json_map.AddMember(code_member, code_value, rapid_json_allocator);

		rapidjson::Value stacktrace_member, stacktrace_value;
		static const char stacktrace_str[] = "stacktrace";

		stacktrace_member.SetString(stacktrace_str, (rapidjson::SizeType)(sizeof(stacktrace_str) - 1));
		stacktrace_value.SetString(exception_stacktrace(ex), strlen(exception_stacktrace(ex)));
		json_map.AddMember(stacktrace_member, stacktrace_value, rapid_json_allocator);
	}
	else if (id == TYPE_THROWABLE)
	{
		rapidjson::Value &json_map = json_v->SetObject();

		throwable th = value_to_throwable(v);

		static const char str[] = "ExceptionThrown";

		size_t size = sizeof(str);

		rapidjson::SizeType length = (rapidjson::SizeType)(size - 1);

		rapidjson::Value json_member, json_inner_value;

		json_member.SetString(str, length);

		rapid_json_serial_impl_serialize_value(throwable_value(th), &json_inner_value);

		json_map.AddMember(json_member, json_inner_value, rapid_json_allocator);
	}
	else if (id == TYPE_PTR)
	{
		std::ostringstream ostream;

		ostream << value_to_ptr(v);

		std::string s = ostream.str();

		json_v->SetString(s.c_str(), (rapidjson::SizeType)s.length());
	}
	else if (id == TYPE_NULL)
	{
		json_v->SetNull();
	}
}